

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_attack(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  random_conflict rVar3;
  random hd;
  artifact *a;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  rVar3 = parser_getrand(p,"hd");
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(char *)((long)pvVar2 + 0x30) = (char)rVar3.dice;
    *(char *)((long)pvVar2 + 0x31) = (char)rVar3.sides;
    wVar1 = parser_getint(p,"to-h");
    *(short *)((long)pvVar2 + 0x28) = (short)wVar1;
    wVar1 = parser_getint(p,"to-d");
    *(short *)((long)pvVar2 + 0x2a) = (short)wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_attack(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct random hd = parser_getrand(p, "hd");

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	a->dd = hd.dice;
	a->ds = hd.sides;
	a->to_h = parser_getint(p, "to-h");
	a->to_d = parser_getint(p, "to-d");
	return PARSE_ERROR_NONE;
}